

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O2

void Gia_PolynCorePrintCones(Gia_Man_t *pGia,Vec_Int_t *vLeaves,int fVerbose)

{
  Gia_Man_t *p;
  uint uVar1;
  int ConeMax;
  int i;
  uint uVar2;
  uint local_40;
  int iObj;
  Gia_Man_t *local_38;
  
  local_38 = pGia;
  if (fVerbose == 0) {
    local_40 = 0;
    uVar2 = 0;
    for (i = 0; i < vLeaves->nSize; i = i + 1) {
      iObj = Vec_IntEntry(vLeaves,i);
      p = local_38;
      uVar1 = Gia_ManSuppSize(local_38,&iObj,1);
      if ((int)local_40 <= (int)uVar1) {
        local_40 = uVar1;
      }
      uVar1 = Gia_ManConeSize(p,&iObj,1);
      if ((int)uVar2 <= (int)uVar1) {
        uVar2 = uVar1;
      }
    }
    printf("Remaining cones:  Count = %d.  SuppMax = %d.  ConeMax = %d.\n",
           (ulong)(uint)vLeaves->nSize,(ulong)local_40,(ulong)uVar2);
  }
  else {
    for (uVar2 = 0; (int)uVar2 < vLeaves->nSize; uVar2 = uVar2 + 1) {
      iObj = Vec_IntEntry(vLeaves,uVar2);
      printf("%4d : ",(ulong)uVar2);
      uVar1 = Gia_ManSuppSize(pGia,&iObj,1);
      printf("Supp = %3d  ",(ulong)uVar1);
      uVar1 = Gia_ManConeSize(pGia,&iObj,1);
      printf("Cone = %3d  ",(ulong)uVar1);
      putchar(10);
    }
  }
  return;
}

Assistant:

void Gia_PolynCorePrintCones( Gia_Man_t * pGia, Vec_Int_t * vLeaves, int fVerbose )
{
    int i, iObj;
    if ( fVerbose )
    {
        Vec_IntForEachEntry( vLeaves, iObj, i )
        {
            printf( "%4d : ", i );
            printf( "Supp = %3d  ", Gia_ManSuppSize(pGia, &iObj, 1) );
            printf( "Cone = %3d  ", Gia_ManConeSize(pGia, &iObj, 1) );
            printf( "\n" );
        }
    }
    else
    {
        int SuppMax = 0, ConeMax = 0;
        Vec_IntForEachEntry( vLeaves, iObj, i )
        {
            SuppMax = Abc_MaxInt( SuppMax, Gia_ManSuppSize(pGia, &iObj, 1) );
            ConeMax = Abc_MaxInt( ConeMax, Gia_ManConeSize(pGia, &iObj, 1) );
        }
        printf( "Remaining cones:  Count = %d.  SuppMax = %d.  ConeMax = %d.\n", Vec_IntSize(vLeaves), SuppMax, ConeMax );
    }
}